

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O0

void get_qual_hostname(char *buf,int len,attr_list attrs,int *network_p,CMTransport_trace trace_func
                      ,void *trace_data)

{
  FILE *__stream;
  undefined8 uVar1;
  code *pcVar2;
  CMTransport_trace p_Var3;
  int iVar4;
  uint32_t uVar5;
  size_t sVar6;
  void *pvVar7;
  char *pcVar8;
  int *piVar9;
  hostent *phVar10;
  int *in_RCX;
  undefined8 in_RDX;
  socklen_t in_ESI;
  CMTransport_trace in_RDI;
  code *in_R8;
  undefined8 in_R9;
  in_addr ip;
  in_addr IP_1;
  char *first_dot;
  char *new_name_str;
  size_t name_len;
  char *iface;
  in_addr IP;
  char str [16];
  in_addr *in;
  int good_addr;
  char **p_1;
  char hostname [1024];
  int gai_result;
  addrinfo *p;
  addrinfo *info;
  addrinfo hints;
  hostent *host_1;
  char *tmp_name;
  int end;
  char *hostname_string;
  char *network_string;
  hostent *host;
  void *in_stack_fffffffffffffaa8;
  CMTransport_trace in_stack_fffffffffffffab0;
  uint32_t local_508;
  uint32_t local_504;
  char *local_500;
  char *local_4f8;
  size_t local_4f0;
  undefined1 local_4e8 [12];
  uint32_t local_4dc;
  char local_4d8 [24];
  uint32_t *local_4c0;
  int local_4b4;
  char **local_4b0;
  char local_4a8 [496];
  char *in_stack_fffffffffffffd48;
  void *in_stack_fffffffffffffd50;
  CMTransport_trace in_stack_fffffffffffffd58;
  addrinfo *local_a0;
  addrinfo *local_98;
  addrinfo local_90;
  hostent *local_60;
  char *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  hostent *local_38;
  undefined8 local_30;
  code *local_28;
  int *local_20;
  undefined8 local_18;
  socklen_t local_c;
  CMTransport_trace local_8;
  
  local_38 = (hostent *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_40 = getenv("ADIOS2_NETWORK");
  local_48 = getenv("ADIOS2_HOSTNAME");
  if (local_48 != (char *)0x0) {
    strncpy((char *)local_8,local_48,(long)(int)local_c);
    return;
  }
  gethostname((char *)local_8,(long)(int)local_c);
  p_Var3 = local_8;
  local_8[(int)(local_c - 1)] = (_func_void_CManager_char_ptr_varargs)0x0;
  sVar6 = strlen((char *)local_8);
  pvVar7 = memchr(p_Var3,0x2e,sVar6);
  if (pvVar7 == (void *)0x0) {
    sVar6 = strlen((char *)local_8);
    local_4c = (int)sVar6;
    local_8[local_4c] = (_func_void_CManager_char_ptr_varargs)0x2e;
    iVar4 = getdomainname((char *)(local_8 + (long)local_4c + 1),
                          (long)(int)((local_c - local_4c) + -1));
    if (iVar4 == -1) {
      local_8[local_4c + 1] = (_func_void_CManager_char_ptr_varargs)0x0;
    }
    if (local_8[local_4c + 1] == (_func_void_CManager_char_ptr_varargs)0x0) {
      local_60 = gethostbyname((char *)local_8);
      local_8[local_4c] = (_func_void_CManager_char_ptr_varargs)0x0;
      if (local_60 != (hostent *)0x0) {
        local_58 = local_60->h_name;
        strncpy((char *)local_8,local_58,(long)(int)local_c);
      }
    }
    local_8[(int)(local_c - 1)] = (_func_void_CManager_char_ptr_varargs)0x0;
  }
  (*local_28)(local_30,"CM<IP_CONFIG> - Tentative Qualified hostname %s",local_8);
  p_Var3 = local_8;
  sVar6 = strlen((char *)local_8);
  pvVar7 = memchr(p_Var3,0x2e,sVar6);
  if (pvVar7 == (void *)0x0) {
    gethostname(local_4a8,0x3ff);
    memset(&local_90,0,0x30);
    local_90.ai_family = 0;
    local_90.ai_socktype = 1;
    local_90.ai_flags = 2;
    iVar4 = getaddrinfo(local_4a8,(char *)0x0,&local_90,&local_98);
    __stream = _stderr;
    if (iVar4 != 0) {
      pcVar8 = gai_strerror(iVar4);
      fprintf(__stream,"getaddrinfo: %s\n",pcVar8);
    }
    for (local_a0 = local_98; local_a0 != (addrinfo *)0x0; local_a0 = local_a0->ai_next) {
      strcpy((char *)local_8,local_a0->ai_canonname);
    }
    freeaddrinfo(local_98);
  }
  if ((*local_8 != (_func_void_CManager_char_ptr_varargs)0x0) &&
     (local_38 = gethostbyname((char *)local_8), local_38 == (hostent *)0x0)) {
    *local_8 = (_func_void_CManager_char_ptr_varargs)0x0;
  }
  if (local_38 != (hostent *)0x0) {
    local_4b4 = 0;
    for (local_4b0 = local_38->h_addr_list; *local_4b0 != (char *)0x0; local_4b0 = local_4b0 + 1) {
      local_4c0 = (uint32_t *)*local_4b0;
      ntohl(*local_4c0);
      iVar4 = ipv4_is_loopback((int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
      if (iVar4 == 0) {
        local_4b4 = local_4b4 + 1;
        inet_ntop(2,local_4c0,local_4d8,0x10);
        pcVar2 = local_28;
        uVar1 = local_30;
        uVar5 = ntohl(*local_4c0);
        (*pcVar2)(uVar1,"CM<IP_CONFIG> - Hostname gets good addr %lx, %s",uVar5,local_4d8);
      }
    }
    if (local_4b4 == 0) {
      *local_8 = (_func_void_CManager_char_ptr_varargs)0x0;
    }
  }
  if (*local_8 == (_func_void_CManager_char_ptr_varargs)0x0) {
    iVar4 = get_string_attr(local_18,CM_IP_INTERFACE,local_4e8);
    if (iVar4 == 0) {
      uVar5 = get_self_ip_addr(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      local_4dc = htonl(uVar5);
    }
    else {
      uVar5 = get_self_ip_iface(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                in_stack_fffffffffffffd48);
      local_4dc = htonl(uVar5);
    }
    (*local_28)(local_30,"CM<IP_CONFIG> - No hostname yet, trying gethostbyaddr on IP %lx",local_4dc
               );
    uVar5 = ntohl(local_4dc);
    iVar4 = is_private_IP(uVar5);
    if (iVar4 == 0) {
      local_38 = gethostbyaddr(&local_4dc,4,2);
      pcVar2 = local_28;
      uVar1 = local_30;
      if (local_38 == (hostent *)0x0) {
        piVar9 = __h_errno_location();
        (*pcVar2)(uVar1,"     FAILED, errno %d",*piVar9);
      }
      else {
        (*local_28)(local_30,"     result was %s",local_38->h_name);
        strncpy((char *)local_8,local_38->h_name,(long)(int)local_c);
      }
    }
  }
  if (local_40 == (char *)0x0) {
    if (get_qual_hostname::CM_NETWORK_POSTFIX == -1) {
      get_qual_hostname::CM_NETWORK_POSTFIX = attr_atom_from_string("ADIOS2_NETWORK_POSTFIX");
    }
    iVar4 = get_string_attr(local_18,get_qual_hostname::CM_NETWORK_POSTFIX,&local_40);
    if (iVar4 == 0) {
      (*local_28)(local_30,"TCP/IP transport found no NETWORK POSTFIX attribute");
    }
    else {
      (*local_28)(local_30,"TCP/IP transport found NETWORK POSTFIX attribute %s",local_40);
    }
  }
  if (local_40 != (char *)0x0) {
    sVar6 = strlen((char *)local_8);
    local_4f0 = strlen(local_40);
    local_4f0 = sVar6 + 2 + local_4f0;
    local_4f8 = (char *)malloc(local_4f0);
    local_500 = strchr((char *)local_8,0x2e);
    memset(local_4f8,0,local_4f0);
    *local_500 = '\0';
    local_500 = local_500 + 1;
    sprintf(local_4f8,"%s%s.%s",local_8,local_40,local_500);
    phVar10 = gethostbyname(local_4f8);
    if ((phVar10 != (hostent *)0x0) && (strcpy((char *)local_8,local_4f8), local_20 != (int *)0x0))
    {
      *local_20 = *local_20 + 1;
    }
    free(local_4f8);
  }
  if ((*local_8 != (_func_void_CManager_char_ptr_varargs)0x0) &&
     (local_38 = gethostbyname((char *)local_8), local_38 != (hostent *)0x0)) {
    in_stack_fffffffffffffab0 = local_8;
    sVar6 = strlen((char *)local_8);
    pvVar7 = memchr(in_stack_fffffffffffffab0,0x2e,sVar6);
    if (pvVar7 != (void *)0x0) goto LAB_00106a14;
  }
  uVar5 = get_self_ip_addr(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  local_504 = htonl(uVar5);
  if (local_504 == 0) {
    if (get_qual_hostname::warn_once == 0) {
      get_qual_hostname::warn_once = 1;
      (*local_28)(local_30,
                  "Attempts to establish your fully qualified hostname, or indeed any\nuseful network name, have failed horribly.  using localhost.\n"
                 );
    }
    strncpy((char *)local_8,"localhost",(long)(int)local_c);
  }
  else {
    uVar5 = get_self_ip_addr(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    local_508 = htonl(uVar5);
    pcVar8 = inet_ntop(2,&local_508,(char *)local_8,local_c);
    if (pcVar8 == (char *)0x0) {
      (*local_28)(local_30,"inet_ntop failed\n");
    }
  }
LAB_00106a14:
  (*local_28)(local_30,"CM<IP_CONFIG> - GetQualHostname returning %s",local_8);
  return;
}

Assistant:

static void
get_qual_hostname(char *buf, int len, attr_list attrs,
		  int *network_p, CMTransport_trace trace_func, void *trace_data)
{
    struct hostent *host = NULL;

    char *network_string = getenv(IPCONFIG_ENVVAR_PREFIX "NETWORK");
    char *hostname_string = getenv(IPCONFIG_ENVVAR_PREFIX "HOSTNAME");
    if (hostname_string != NULL) {
	strncpy(buf, hostname_string, len);
	return;
    }
    (void)get_qual_hostname;
    gethostname(buf, len);
    buf[len - 1] = '\0';
    if (memchr(buf, '.', strlen(buf)) == NULL) {
	/* no dots, probably not fully qualified */
#ifdef HAVE_GETDOMAINNAME
	int end = strlen(buf);
	buf[end] = '.';
	if (getdomainname((&buf[end]) + 1, len - end - 1) == -1) {
	    buf[end+1]=0;
	}
	if (buf[end + 1] == 0) {
	    char *tmp_name;
	    struct hostent *host = gethostbyname(buf);
	    buf[end] = 0;
	    /* getdomainname was useless, hope that gethostbyname helps */
	    if (host) {
		tmp_name = host->h_name;
		strncpy(buf, tmp_name, len);
	    }		
	}
#else
	{
	    /* no getdomainname, hope that gethostbyname will help */
	    struct hostent *he = gethostbyname(buf);
	    char *tmp_name;
	    if (he) {
		tmp_name = (gethostbyname(buf))->h_name;
		strncpy(buf, tmp_name, len);
	    }
	}
#endif
	buf[len - 1] = '\0';
    }
    trace_func(trace_data, "CM<IP_CONFIG> - Tentative Qualified hostname %s", buf);
    if (memchr(buf, '.', strlen(buf)) == NULL) {
	/* useless hostname if it's not fully qualified */
	struct addrinfo hints, *info, *p;
	int gai_result;

	char hostname[1024];
	hostname[1023] = '\0';
	gethostname(hostname, 1023);

	memset(&hints, 0, sizeof hints);
	hints.ai_family = AF_UNSPEC; /*either IPV4 or IPV6*/
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_CANONNAME;

	if ((gai_result = getaddrinfo(hostname, NULL, &hints, &info)) != 0) {
	    fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(gai_result));
	}

	for(p = info; p != NULL; p = p->ai_next) {
	    strcpy(buf, p->ai_canonname);
	}

	freeaddrinfo(info);
    }
    if ((buf[0] != 0) && ((host = gethostbyname(buf)) == NULL)) {
	/* useless hostname if we can't translate it */
	buf[0] = 0;
    }
    if (host != NULL) {
	char **p;
	int good_addr = 0;
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
	        char str[INET_ADDRSTRLEN];
		good_addr++;
					      
		inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		trace_func(trace_data, "CM<IP_CONFIG> - Hostname gets good addr %lx, %s",
			   ntohl(in->s_addr), str);
	    }
	}
	if (good_addr == 0) {
	    /* 
	     * even a fully qualifiedhostname that doesn't get us a valid
	     * IP addr is useless
	     */
	    buf[0] = 0;
	}
    }
    if (buf[0] == 0) {
	/* bloody hell, what do you have to do? */
	struct in_addr IP;
	extern int h_errno;
	char *iface;
	if (get_string_attr(attrs, CM_IP_INTERFACE, &iface)){
	    IP.s_addr = htonl(get_self_ip_iface(trace_func, trace_data, iface));
	} else {
	    IP.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	}
	trace_func(trace_data, "CM<IP_CONFIG> - No hostname yet, trying gethostbyaddr on IP %lx", IP);
	if (!is_private_IP(ntohl(IP.s_addr))) {
	    host = gethostbyaddr((char *) &IP, sizeof(IP), AF_INET);
	    if (host != NULL) {
		trace_func(trace_data, "     result was %s", host->h_name);
		strncpy(buf, host->h_name, len);
	    } else {
		trace_func(trace_data, "     FAILED, errno %d", h_errno);
	    }
	}
    }
    if (network_string == NULL) {
	static atom_t CM_NETWORK_POSTFIX = -1;
	if (CM_NETWORK_POSTFIX == -1) {
	    CM_NETWORK_POSTFIX = attr_atom_from_string(IPCONFIG_ENVVAR_PREFIX "NETWORK_POSTFIX");
	}
	if (!get_string_attr(attrs, CM_NETWORK_POSTFIX, &network_string)) {
	    trace_func(trace_data, "TCP/IP transport found no NETWORK POSTFIX attribute");
	} else {
	    trace_func(trace_data, "TCP/IP transport found NETWORK POSTFIX attribute %s", network_string);
	}
    }
    if (network_string != NULL) {
	size_t name_len = strlen(buf) + 2 + strlen(network_string);
	char *new_name_str = malloc(name_len);
	char *first_dot = strchr(buf, '.');

	/* stick the CM_NETWORK value in there */
	memset(new_name_str, 0, name_len);
	*first_dot = 0;
	first_dot++;
	sprintf(new_name_str, "%s%s.%s", buf, network_string, first_dot);
	if (gethostbyname(new_name_str) != NULL) {
	    /* host has no NETWORK interface */
	    strcpy(buf, new_name_str);
	    if (network_p) (*network_p)++;
	}
	free(new_name_str);
    }

    if ((buf[0] == 0) ||
	((host = gethostbyname(buf)) == NULL) ||
	(memchr(buf, '.', strlen(buf)) == NULL)) {
	/* just use the bloody IP address */
	struct in_addr IP;
	IP.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	if (IP.s_addr != 0) {
	    struct in_addr ip;
	    ip.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	    if (!inet_ntop(AF_INET, &(ip.s_addr), buf, len)) {
	        trace_func(trace_data, "inet_ntop failed\n");
	    }
	} else {
	    static int warn_once = 0;
	    if (warn_once == 0) {
		warn_once++;
		trace_func(trace_data, "Attempts to establish your fully qualified hostname, or indeed any\nuseful network name, have failed horribly.  using localhost.\n");
	    }
	    strncpy(buf, "localhost", len);
	}
    }
    trace_func(trace_data, "CM<IP_CONFIG> - GetQualHostname returning %s", buf);
}